

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O2

void WebRtcSpl_LPBy2ShortToInt(int16_t *in,int32_t len,int32_t *out,int32_t *state)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = state[0xc];
  uVar1 = 0;
  uVar2 = (ulong)(uint)(len >> 1);
  if (len >> 1 < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    iVar3 = state[1];
    iVar5 = ((int)((uVar4 - iVar3) + 0x2000) >> 0xe) * 0xbea + *state;
    *state = uVar4;
    state[1] = iVar5;
    iVar5 = iVar5 - state[2];
    iVar3 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x2498 + iVar3;
    iVar5 = iVar3 - state[3];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x3ad7 + state[2];
    state[3] = iVar5;
    state[2] = iVar3;
    out[uVar1 * 2] = iVar5 >> 1;
    uVar4 = (int)in[uVar1 * 2 + 1] << 0xf | 0x4000;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar4 = (int)in[uVar1 * 2] << 0xf | 0x4000;
    iVar3 = state[5];
    iVar5 = ((int)((uVar4 - iVar3) + 0x2000) >> 0xe) * 0x335 + state[4];
    state[4] = uVar4;
    state[5] = iVar5;
    iVar5 = iVar5 - state[6];
    iVar3 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x17de + iVar3;
    iVar5 = iVar3 - state[7];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x305e + state[6];
    state[7] = iVar5;
    state[6] = iVar3;
    out[uVar1 * 2] = (iVar5 >> 1) + out[uVar1 * 2] >> 0xf;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar4 = (int)in[uVar1 * 2] << 0xf | 0x4000;
    iVar3 = state[9];
    iVar5 = ((int)((uVar4 - iVar3) + 0x2000) >> 0xe) * 0xbea + state[8];
    state[8] = uVar4;
    state[9] = iVar5;
    iVar5 = iVar5 - state[10];
    iVar3 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x2498 + iVar3;
    iVar5 = iVar3 - state[0xb];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x3ad7 + state[10];
    state[0xb] = iVar5;
    state[10] = iVar3;
    out[uVar1 * 2 + 1] = iVar5 >> 1;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    uVar4 = (int)in[uVar1 * 2 + 1] << 0xf | 0x4000;
    iVar3 = state[0xd];
    iVar5 = ((int)((uVar4 - iVar3) + 0x2000) >> 0xe) * 0x335 + state[0xc];
    state[0xc] = uVar4;
    state[0xd] = iVar5;
    iVar5 = iVar5 - state[0xe];
    iVar3 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x17de + iVar3;
    iVar5 = iVar3 - state[0xf];
    iVar5 = ((iVar5 >> 0xe) - (iVar5 >> 0x1f)) * 0x305e + state[0xe];
    state[0xf] = iVar5;
    state[0xe] = iVar3;
    out[uVar1 * 2 + 1] = (iVar5 >> 1) + out[uVar1 * 2 + 1] >> 0xf;
  }
  return;
}

Assistant:

void WebRtcSpl_LPBy2ShortToInt(const int16_t* in, int32_t len, int32_t* out,
                               int32_t* state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    len >>= 1;

    // lower allpass filter: odd input -> even output samples
    in++;
    // initial state of polyphase delay element
    tmp0 = state[12];
    for (i = 0; i < len; i++)
    {
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, round and store
        out[i << 1] = state[3] >> 1;
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
    }
    in--;

    // upper allpass filter: even input -> even output samples
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // average the two allpass outputs, scale down and store
        out[i << 1] = (out[i << 1] + (state[7] >> 1)) >> 15;
    }

    // switch to odd output samples
    out++;

    // lower allpass filter: even input -> odd output samples
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[9];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[8] + diff * kResampleAllpass[1][0];
        state[8] = tmp0;
        diff = tmp1 - state[10];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[9] + diff * kResampleAllpass[1][1];
        state[9] = tmp1;
        diff = tmp0 - state[11];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[11] = state[10] + diff * kResampleAllpass[1][2];
        state[10] = tmp0;

        // scale down, round and store
        out[i << 1] = state[11] >> 1;
    }

    // upper allpass filter: odd input -> odd output samples
    in++;
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[13];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[12] + diff * kResampleAllpass[0][0];
        state[12] = tmp0;
        diff = tmp1 - state[14];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[13] + diff * kResampleAllpass[0][1];
        state[13] = tmp1;
        diff = tmp0 - state[15];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[15] = state[14] + diff * kResampleAllpass[0][2];
        state[14] = tmp0;

        // average the two allpass outputs, scale down and store
        out[i << 1] = (out[i << 1] + (state[15] >> 1)) >> 15;
    }
}